

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformBlockTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::BlockSingleStructCase::init(BlockSingleStructCase *this,EVP_PKEY_CTX *ctx)

{
  ShaderInterface *this_00;
  deUint32 dVar1;
  StructType *this_01;
  UniformBlock *pUVar2;
  Uniform local_78;
  VarType local_38;
  
  this_00 = &(this->super_UniformBlockCase).m_interface;
  this_01 = deqp::gls::ub::ShaderInterface::allocStruct(this_00,"S");
  deqp::gls::ub::VarType::VarType((VarType *)&local_78,TYPE_INT_VEC3,4);
  deqp::gls::ub::StructType::addMember(this_01,"a",(VarType *)&local_78,0xc00);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_78);
  deqp::gls::ub::VarType::VarType(&local_38,TYPE_FLOAT_MAT3,2);
  deqp::gls::ub::VarType::VarType((VarType *)&local_78,&local_38,4);
  deqp::gls::ub::StructType::addMember(this_01,"b",(VarType *)&local_78,0);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_78);
  deqp::gls::ub::VarType::~VarType(&local_38);
  deqp::gls::ub::VarType::VarType((VarType *)&local_78,TYPE_FLOAT_VEC4,4);
  deqp::gls::ub::StructType::addMember(this_01,"c",(VarType *)&local_78,0);
  deqp::gls::ub::VarType::~VarType((VarType *)&local_78);
  pUVar2 = deqp::gls::ub::ShaderInterface::allocBlock(this_00,"Block");
  deqp::gls::ub::VarType::VarType(&local_38,this_01);
  deqp::gls::ub::Uniform::Uniform(&local_78,"s",&local_38,0);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::push_back
            (&pUVar2->m_uniforms,&local_78);
  deqp::gls::ub::VarType::~VarType(&local_78.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_name._M_dataplus._M_p != &local_78.m_name.field_2) {
    operator_delete(local_78.m_name._M_dataplus._M_p,
                    local_78.m_name.field_2._M_allocated_capacity + 1);
  }
  deqp::gls::ub::VarType::~VarType(&local_38);
  dVar1 = this->m_layoutFlags;
  pUVar2->m_flags = dVar1;
  if (0 < this->m_numInstances) {
    std::__cxx11::string::_M_replace
              ((ulong)&pUVar2->m_instanceName,0,(char *)(pUVar2->m_instanceName)._M_string_length,
               0x1c86f6e);
    dVar1 = this->m_numInstances;
    pUVar2->m_arraySize = dVar1;
  }
  return dVar1;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, PRECISION_HIGH), UNUSED_BOTH); // First member is unused.
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH));

		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("s", VarType(&typeS), 0));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}
	}